

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  MElementType MVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  
  uVar3 = pztopology::TPZTetrahedron::NumSides(2);
  iVar4 = pztopology::TPZTetrahedron::NumSides(1);
  uVar10 = 0;
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,0);
  if (0 < (int)uVar3) {
    uVar16 = 0;
    uVar10 = 0;
    do {
      lVar7 = (long)iVar4 + uVar16;
      iVar1 = firstHCurlFunc->fStore[lVar7];
      iVar18 = conOrders->fStore[lVar7];
      MVar5 = pztopology::TPZTetrahedron::Type((int)lVar7 + 4);
      if (MVar5 == EQuadrilateral) {
        (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs);
        piVar2 = filteredFuncs->fStore;
        lVar7 = 0;
        iVar11 = 0;
        iVar6 = iVar1;
        do {
          if (0 < iVar18) {
            lVar13 = 0;
            do {
              piVar2[(int)uVar10 + lVar13] = iVar6 + (int)lVar13;
              lVar13 = lVar13 + 1;
            } while (iVar18 != (int)lVar13);
            uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar13);
          }
          iVar11 = iVar11 + 1;
          iVar6 = iVar6 + iVar18;
        } while (iVar11 != 3);
        iVar6 = iVar18 + -1;
        uVar17 = iVar6 * iVar6 * 2;
        if (0 < (int)uVar17) {
          piVar2 = filteredFuncs->fStore;
          uVar8 = 0;
          do {
            if ((uVar8 & 1) != 0) {
              piVar2[(int)uVar10] = iVar1 + iVar18 * 4 + uVar8;
              uVar10 = (ulong)((int)uVar10 + 1);
            }
            uVar8 = uVar8 + 1;
          } while (uVar17 != uVar8);
        }
        if (1 < iVar18) {
          piVar2 = filteredFuncs->fStore;
          do {
            piVar2[(int)uVar10 + lVar7] = uVar17 + iVar1 + iVar18 * 5 + -1 + (int)lVar7;
            lVar7 = lVar7 + 1;
          } while (iVar6 != (int)lVar7);
          uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar7);
        }
      }
      else {
        if (MVar5 != ETriangle) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeTetra>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeTetra]"
                     ,0xad);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," error. Not yet implemented",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                     ,0x138);
        }
        if (1 < iVar18) {
          iVar11 = iVar18 + -1;
          (*filteredFuncs->_vptr_TPZVec[3])
                    (filteredFuncs,(long)(int)(((uint)((iVar18 + 2) * iVar11) >> 1) + (int)uVar10));
          piVar2 = filteredFuncs->fStore;
          iVar6 = iVar1;
          bVar19 = true;
          do {
            bVar14 = bVar19;
            uVar9 = uVar10;
            iVar15 = (int)uVar9;
            lVar7 = 0;
            do {
              piVar2[iVar15 + lVar7] = iVar6 + (int)lVar7;
              lVar7 = lVar7 + 1;
            } while (iVar11 != (int)lVar7);
            iVar6 = iVar6 + iVar11;
            uVar10 = (ulong)(uint)(iVar15 + (int)lVar7);
            bVar19 = false;
          } while (bVar14);
          uVar17 = (iVar18 + -2) * iVar11;
          uVar10 = (uVar9 & 0xffffffff) + lVar7;
          if (0 < (int)uVar17) {
            piVar2 = filteredFuncs->fStore;
            uVar8 = 0;
            do {
              if ((uVar8 & 1) != 0) {
                piVar2[(int)uVar10] = iVar11 * 3 + iVar1 + uVar8;
                uVar10 = (ulong)((int)uVar10 + 1);
              }
              uVar8 = uVar8 + 1;
            } while (uVar17 != uVar8);
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar3);
  }
  iVar1 = conOrders->fStore[(int)(iVar4 + uVar3)];
  iVar4 = firstHCurlFunc->fStore[(int)(iVar4 + uVar3)];
  iVar18 = (iVar1 + -2) * (iVar1 + -1);
  (*filteredFuncs->_vptr_TPZVec[3])();
  iVar6 = iVar18 / 2;
  iVar18 = iVar18 * 2;
  if (iVar6 < iVar18) {
    piVar2 = filteredFuncs->fStore;
    lVar7 = 0;
    do {
      piVar2[(int)uVar10 + lVar7] = iVar6 + iVar4 + (int)lVar7;
      lVar7 = lVar7 + 1;
    } while (iVar18 - iVar6 != (int)lVar7);
    uVar10 = (ulong)(uint)((int)uVar10 + (int)lVar7);
  }
  if (3 < iVar1) {
    iVar18 = iVar18 + iVar4;
    iVar4 = 4;
    do {
      iVar11 = (iVar4 + -3) * (iVar4 * 3 + -6);
      iVar6 = iVar11 / 2;
      if (1 < iVar11) {
        piVar2 = filteredFuncs->fStore;
        iVar12 = 0;
        uVar16 = 0;
        iVar15 = iVar6;
        iVar11 = iVar18;
        do {
          if ((int)(uVar16 / 3) * 3 + iVar12 != 0) {
            piVar2[(int)uVar10] = iVar11;
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          uVar16 = (ulong)((int)uVar16 + 1);
          iVar11 = iVar11 + 1;
          iVar12 = iVar12 + -1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      iVar18 = iVar18 + iVar6;
      bVar19 = iVar4 != iVar1;
      iVar4 = iVar4 + 1;
    } while (bVar19);
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}